

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O3

void __thiscall KokkosTools::SpaceTimeStack::State::~State(State *this)

{
  State *pSVar1;
  pointer pcVar2;
  long lVar3;
  char *pcVar4;
  ostream *poVar5;
  size_t sVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  Allocations *this_00;
  StackNode inv_stack_root;
  undefined1 local_230 [8];
  _Alloc_hider local_228;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  _Rb_tree<KokkosTools::SpaceTimeStack::StackNode,_KokkosTools::SpaceTimeStack::StackNode,_std::_Identity<KokkosTools::SpaceTimeStack::StackNode>,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
  local_200 [4];
  ios_base local_138 [264];
  
  lVar3 = std::chrono::_V2::system_clock::now();
  pSVar1 = (State *)this->stack_frame;
  if (pSVar1 == this) {
    (pSVar1->stack_root).total_runtime =
         (double)(lVar3 - (pSVar1->stack_root).start_time.impl.__d.__r) * 1e-09 +
         (pSVar1->stack_root).total_runtime;
    StackNode::adopt(&this->stack_root);
    StackNode::reduce_over_mpi(&this->stack_root,false);
    pcVar4 = getenv("KOKKOS_PROFILE_EXPORT_JSON");
    if (pcVar4 == (char *)0x0) {
      StackNode::invert((StackNode *)local_230,&this->stack_root);
      StackNode::reduce_over_mpi((StackNode *)local_230,false);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nBEGIN KOKKOS PROFILING REPORT:\n",0x20);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"TOTAL TIME: ",0xc);
      poVar5 = std::ostream::_M_insert<double>((this->stack_root).max_runtime);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5," seconds\n",9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"TOP-DOWN TIME TREE:\n",0x14);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "<average time> <percent of total time> <percent time in Kokkos> <percent MPI imbalance> <remainder> <kernels per second> <number of calls> <name> [type]\n"
                 ,0x99);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"===================\n",0x14);
      StackNode::print(&this->stack_root,(ostream *)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"BOTTOM-UP TIME TREE:\n",0x15);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "<average time> <percent of total time> <percent time in Kokkos> <percent MPI imbalance> <number of calls> <name> [type]\n"
                 ,0x78);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"===================\n",0x14);
      StackNode::print((StackNode *)local_230,(ostream *)&std::cout);
      this_00 = this->hwm_allocations;
      lVar3 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"KOKKOS ",7);
        pcVar4 = *(char **)((long)&PTR_anon_var_dwarf_236a1_00137ab8 + lVar3);
        sVar6 = strlen(pcVar4);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar4,sVar6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," SPACE:\n",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"===================\n",0x14);
        std::ostream::flush();
        Allocations::print(this_00,(ostream *)&std::cout,false);
        lVar3 = lVar3 + 8;
        this_00 = this_00 + 1;
      } while (lVar3 != 0x28);
      print_process_hwm(false);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"END KOKKOS PROFILING REPORT.\n",0x1d);
      std::ostream::flush();
      std::
      _Rb_tree<KokkosTools::SpaceTimeStack::StackNode,_KokkosTools::SpaceTimeStack::StackNode,_std::_Identity<KokkosTools::SpaceTimeStack::StackNode>,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
      ::~_Rb_tree(local_200);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_p != &local_218) {
        operator_delete(local_228._M_p,local_218._M_allocated_capacity + 1);
      }
    }
    else {
      std::ofstream::ofstream((ofstream *)local_230,"noname.json",_S_out);
      StackNode::print_json(&this->stack_root,(ostream *)local_230);
      local_230 = (undefined1  [8])_VTT;
      *(undefined8 *)(local_230 + _VTT[-1].number_of_calls) = ___throw_bad_array_new_length;
      std::filebuf::~filebuf((filebuf *)&local_228);
      std::ios_base::~ios_base(local_138);
    }
    lVar3 = 0x2a0;
    do {
      std::
      _Rb_tree<KokkosTools::SpaceTimeStack::Allocation,_KokkosTools::SpaceTimeStack::Allocation,_std::_Identity<KokkosTools::SpaceTimeStack::Allocation>,_std::less<KokkosTools::SpaceTimeStack::Allocation>,_std::allocator<KokkosTools::SpaceTimeStack::Allocation>_>
      ::~_Rb_tree((_Rb_tree<KokkosTools::SpaceTimeStack::Allocation,_KokkosTools::SpaceTimeStack::Allocation,_std::_Identity<KokkosTools::SpaceTimeStack::Allocation>,_std::less<KokkosTools::SpaceTimeStack::Allocation>,_std::allocator<KokkosTools::SpaceTimeStack::Allocation>_>
                   *)((long)&(this->stack_root).parent + lVar3));
      lVar3 = lVar3 + -0x38;
    } while (lVar3 != 0x188);
    lVar3 = 0x188;
    do {
      std::
      _Rb_tree<KokkosTools::SpaceTimeStack::Allocation,_KokkosTools::SpaceTimeStack::Allocation,_std::_Identity<KokkosTools::SpaceTimeStack::Allocation>,_std::less<KokkosTools::SpaceTimeStack::Allocation>,_std::allocator<KokkosTools::SpaceTimeStack::Allocation>_>
      ::~_Rb_tree((_Rb_tree<KokkosTools::SpaceTimeStack::Allocation,_KokkosTools::SpaceTimeStack::Allocation,_std::_Identity<KokkosTools::SpaceTimeStack::Allocation>,_std::less<KokkosTools::SpaceTimeStack::Allocation>,_std::allocator<KokkosTools::SpaceTimeStack::Allocation>_>
                   *)((long)&(this->stack_root).parent + lVar3));
      lVar3 = lVar3 + -0x38;
    } while (lVar3 != 0x70);
    std::
    _Rb_tree<KokkosTools::SpaceTimeStack::StackNode,_KokkosTools::SpaceTimeStack::StackNode,_std::_Identity<KokkosTools::SpaceTimeStack::StackNode>,_std::less<KokkosTools::SpaceTimeStack::StackNode>,_std::allocator<KokkosTools::SpaceTimeStack::StackNode>_>
    ::~_Rb_tree(&(this->stack_root).children._M_t);
    pcVar2 = (this->stack_root).name._M_dataplus._M_p;
    paVar7 = &(this->stack_root).name.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar7) {
      operator_delete(pcVar2,paVar7->_M_allocated_capacity + 1);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Program ended before \"",0x16);
  StackNode::get_full_name_abi_cxx11_((string *)local_230,this->stack_frame);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(char *)local_230,(long)local_228._M_p);
  std::operator<<(poVar5,"\" ended\n");
  std::__cxx11::string::~string((string *)local_230);
  abort();
}

Assistant:

~State() {
    bool mpi_usable = false;
#if USE_MPI
    int mpi_initialized;
    MPI_Initialized(&mpi_initialized);
    if (static_cast<bool>(mpi_initialized)) mpi_usable = true;
#endif
    auto end_time = now();
    if (stack_frame != &stack_root) {
      std::cerr << "Program ended before \"" << stack_frame->get_full_name()
                << "\" ended\n";
      abort();
    }
    stack_frame->end(end_time);
    stack_root.adopt();
    stack_root.reduce_over_mpi(mpi_usable);
    if (getenv("KOKKOS_PROFILE_EXPORT_JSON")) {
#if USE_MPI
      if (mpi_usable) {
        int rank;
        MPI_Comm_rank(MPI_COMM_WORLD, &rank);
        if (rank == 0) {
          std::ofstream fout("noname.json");
          stack_root.print_json(fout);
        }
      } else
#endif
      {
        std::ofstream fout("noname.json");
        stack_root.print_json(fout);
      }
      return;
    }

    auto inv_stack_root = stack_root.invert();
    inv_stack_root.reduce_over_mpi(mpi_usable);

#if USE_MPI
    if (mpi_usable) {
      int rank;
      MPI_Comm_rank(MPI_COMM_WORLD, &rank);
      if (rank == 0) {
        std::cout << "\nBEGIN KOKKOS PROFILING REPORT:\n";
        std::cout << "TOTAL TIME: " << stack_root.max_runtime << " seconds\n";
        std::cout << "TOP-DOWN TIME TREE:\n";
        std::cout << "<average time> <percent of total time> <percent time in "
                     "Kokkos> <percent MPI imbalance> <remainder> <kernels per "
                     "second> <number of calls> <name> [type]\n";
        std::cout << "=================== \n";
        stack_root.print(std::cout);
        std::cout << "BOTTOM-UP TIME TREE:\n";
        std::cout << "<average time> <percent of total time> <percent time in "
                     "Kokkos> <percent MPI imbalance> <number of calls> <name> "
                     "[type]\n";
        std::cout << "=================== \n";
        inv_stack_root.print(std::cout);
      }
      for (int space = 0; space < NSPACES; ++space) {
        if (rank == 0) {
          std::cout << "KOKKOS " << get_space_name(space) << " SPACE:\n";
          std::cout << "=================== \n";
          std::cout.flush();
        }
        hwm_allocations[space].print(std::cout, mpi_usable);
      }
      print_process_hwm(mpi_usable);
      if (rank == 0) {
        std::cout << "END KOKKOS PROFILING REPORT.\n";
        std::cout.flush();
      }
    } else
#endif
    {
      std::cout << "\nBEGIN KOKKOS PROFILING REPORT:\n";
      std::cout << "TOTAL TIME: " << stack_root.max_runtime << " seconds\n";
      std::cout << "TOP-DOWN TIME TREE:\n";
      std::cout << "<average time> <percent of total time> <percent time in "
                   "Kokkos> <percent MPI imbalance> <remainder> <kernels per "
                   "second> <number of calls> <name> [type]\n";
      std::cout << "===================\n";
      stack_root.print(std::cout);
      std::cout << "BOTTOM-UP TIME TREE:\n";
      std::cout
          << "<average time> <percent of total time> <percent time in Kokkos> "
             "<percent MPI imbalance> <number of calls> <name> [type]\n";
      std::cout << "===================\n";
      inv_stack_root.print(std::cout);

      for (int space = 0; space < NSPACES; ++space) {
        std::cout << "KOKKOS " << get_space_name(space) << " SPACE:\n";
        std::cout << "===================\n";
        std::cout.flush();
        hwm_allocations[space].print(std::cout, mpi_usable);
      }
      print_process_hwm(mpi_usable);
      std::cout << "END KOKKOS PROFILING REPORT.\n";
      std::cout.flush();
    }
  }